

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

string * cmSystemTools::TrimWhitespace(string *__return_storage_ptr__,string *s)

{
  size_type sVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  size_type sVar5;
  
  pcVar2 = (s->_M_dataplus)._M_p;
  sVar1 = s->_M_string_length;
  pcVar4 = pcVar2;
  sVar5 = sVar1;
  for (pcVar3 = pcVar2; (sVar5 != 0 && (pcVar4 = pcVar3, *pcVar3 < '!')); pcVar3 = pcVar3 + 1) {
    sVar5 = sVar5 - 1;
    pcVar4 = pcVar2 + sVar1;
  }
  if (pcVar4 == pcVar2 + sVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    pcVar2 = pcVar2 + sVar1 + 1;
    do {
      pcVar4 = pcVar2 + -2;
      pcVar2 = pcVar2 + -1;
    } while (*pcVar4 < '!');
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::TrimWhitespace(const std::string& s)
{
  std::string::const_iterator start = s.begin();
  while(start != s.end() && *start <= ' ')
    ++start;
  if (start == s.end())
    return "";

  std::string::const_iterator stop = s.end()-1;
  while(*stop <= ' ')
    --stop;
  return std::string(start, stop+1);
}